

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lognormal_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::lognormal_dist<float>::pdf(lognormal_dist<float> *this,result_type_conflict1 x)

{
  param_type *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  result_type_conflict1 rVar2;
  result_type_conflict1 rVar3;
  double dVar4;
  result_type_conflict1 t;
  undefined4 local_4;
  
  if (0.0 < in_XMM0_Da) {
    fVar1 = math::ln(0.0);
    rVar2 = param_type::mu(in_RDI);
    rVar3 = param_type::sigma(in_RDI);
    fVar1 = (fVar1 - rVar2) / rVar3;
    rVar2 = param_type::sigma(in_RDI);
    dVar4 = std::exp((double)(ulong)(uint)((-fVar1 * fVar1) / 2.0));
    local_4 = (0.3989423 / (in_XMM0_Da * rVar2)) * SUB84(dVar4,0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

pdf(result_type x) const {
      if (x <= 0)
        return 0;
      result_type t((math::ln(x) - P.mu()) / P.sigma());
      return math::constants<result_type>::one_over_sqrt_2pi / (x * P.sigma()) *
             math::exp(-t * t / 2);
    }